

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  WebPAuxStats *pWVar2;
  WebPEncodingError WVar3;
  int iVar4;
  uint32_t bits;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  WebPAuxStats *stats;
  int percent;
  int local_84;
  uint8_t *local_80;
  VP8LBitWriter bw;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  
  percent = 0;
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if ((config == (WebPConfig *)0x0) || (picture->argb == (uint32_t *)0x0)) {
    iVar5 = WebPEncodingSetError(picture,VP8_ENC_ERROR_NULL_PARAMETER);
    return iVar5;
  }
  iVar5 = picture->width;
  iVar1 = picture->height;
  iVar4 = VP8LBitWriterInit(&bw,(long)(iVar1 * iVar5 << (config->image_hint != WEBP_HINT_GRAPH)));
  if (iVar4 == 0) goto LAB_0013210d;
  iVar4 = WebPReportProgress(picture,1,&percent);
  if (iVar4 == 0) goto LAB_001322c3;
  pWVar2 = picture->stats;
  local_84 = iVar5;
  if (pWVar2 != (WebPAuxStats *)0x0) {
    memset(pWVar2,0,0xbc);
    pWVar2->PSNR[0] = 99.0;
    pWVar2->PSNR[1] = 99.0;
    pWVar2->PSNR[2] = 99.0;
    pWVar2->PSNR[3] = 99.0;
    pWVar2->PSNR[4] = 99.0;
  }
  iVar5 = picture->height;
  VP8LPutBits(&bw,picture->width - 1,0xe);
  VP8LPutBits(&bw,iVar5 - 1,0xe);
  if (bw.error_ == 0) {
    bits = WebPPictureHasTransparency(picture);
    VP8LPutBits(&bw,bits,1);
    VP8LPutBits(&bw,0,3);
    if (bw.error_ != 0) goto LAB_0013210d;
    iVar5 = WebPReportProgress(picture,2,&percent);
    if (iVar5 != 0) {
      iVar5 = VP8LEncodeStream(config,picture,&bw);
      if (iVar5 == 0) goto LAB_001322ce;
      iVar5 = WebPReportProgress(picture,99,&percent);
      if (iVar5 == 0) goto LAB_001322c3;
      puVar6 = VP8LBitWriterFinish(&bw);
      if (bw.error_ == 0) {
        lVar8 = (long)(bw.used_ + 7 >> 3);
        puVar7 = bw.cur_ + (lVar8 - (long)bw.buf_) + 1;
        uVar9 = (ulong)((uint)puVar7 & 1);
        local_80 = bw.cur_ + (lVar8 - (long)bw.buf_) + uVar9 + 0xd;
        local_48 = 0x46464952;
        uStack_40 = 0x50424557;
        uStack_3c = 0x4c385056;
        uStack_34 = 0x2f;
        uStack_44 = SUB84(local_80,0);
        uStack_38 = SUB81(puVar7,0);
        uStack_37 = (undefined1)((ulong)puVar7 >> 8);
        uStack_36 = (undefined1)((ulong)puVar7 >> 0x10);
        uStack_35 = (undefined1)((ulong)puVar7 >> 0x18);
        iVar5 = (*picture->writer)((uint8_t *)&local_48,0x15,picture);
        if ((iVar5 == 0) ||
           (iVar4 = (*picture->writer)(puVar6,(size_t)(bw.cur_ + (lVar8 - (long)bw.buf_)),picture),
           iVar5 = local_84, iVar4 == 0)) {
          WVar3 = VP8_ENC_ERROR_BAD_WRITE;
          goto LAB_00132260;
        }
        if (uVar9 != 0) {
          local_48 = local_48 & 0xffffff00;
          iVar4 = (*picture->writer)((uint8_t *)&local_48,1,picture);
          if (iVar4 != 0) goto LAB_00132253;
          iVar4 = WebPEncodingSetError(picture,VP8_ENC_ERROR_BAD_WRITE);
          goto LAB_0013226d;
        }
LAB_00132253:
        iVar10 = (int)local_80 + 8;
      }
      else {
        WVar3 = VP8_ENC_ERROR_OUT_OF_MEMORY;
LAB_00132260:
        iVar4 = WebPEncodingSetError(picture,WVar3);
        iVar5 = local_84;
LAB_0013226d:
        iVar10 = 0;
        if (iVar4 == 0) goto LAB_001322ce;
      }
      iVar4 = WebPReportProgress(picture,100,&percent);
      if (iVar4 != 0) {
        pWVar2 = picture->stats;
        if (pWVar2 != (WebPAuxStats *)0x0) {
          pWVar2->coded_size = pWVar2->coded_size + iVar10;
          pWVar2->lossless_size = iVar10;
        }
        if (picture->extra_info != (uint8_t *)0x0) {
          memset(picture->extra_info,0,(long)((iVar1 + 0xf >> 4) * (iVar5 + 0xf >> 4)));
        }
        goto LAB_001322ce;
      }
    }
LAB_001322c3:
    WVar3 = VP8_ENC_ERROR_USER_ABORT;
  }
  else {
LAB_0013210d:
    WVar3 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  WebPEncodingSetError(picture,WVar3);
LAB_001322ce:
  if (bw.error_ != 0) {
    WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&bw);
  return (uint)(picture->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    WebPEncodingSetError(picture, VP8_ENC_ERROR_USER_ABORT);
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 2, &percent)) goto UserAbort;

  // Encode main image stream.
  if (!VP8LEncodeStream(config, picture, &bw)) goto Error;

  if (!WebPReportProgress(picture, 99, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  if (!WriteImage(picture, &bw, &coded_size)) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error_) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&bw);
  return (picture->error_code == VP8_ENC_OK);
}